

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

byte * __thiscall
Js::ByteCodeBufferReader::ReadPropertyIdOfFormals
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function)

{
  Type TVar1;
  byte *pbVar2;
  PropertyIdArray *pPVar3;
  int i_1;
  uint uVar4;
  uint i;
  ulong uVar5;
  uint local_40;
  bool local_3a;
  bool local_39;
  uint32 count;
  bool hadDuplicates;
  bool has__proto__;
  int id;
  byte extraSlotCount;
  bool hasNonSimpleParams;
  
  local_40 = 0;
  pbVar2 = ReadUInt32(this,current,&local_40);
  hadDuplicates = false;
  pbVar2 = ReadByte(this,pbVar2,&hadDuplicates);
  pPVar3 = FunctionBody::AllocatePropertyIdArrayForFormals
                     (function,(local_40 + hadDuplicates) * 4,local_40,hadDuplicates);
  pPVar3->count = local_40;
  local_3a = false;
  pbVar2 = ReadBool(this,pbVar2,&local_3a);
  pPVar3->hadDuplicates = local_3a;
  local_39 = false;
  pbVar2 = ReadBool(this,pbVar2,&local_39);
  pPVar3->has__proto__ = local_39;
  has__proto__ = false;
  pbVar2 = ReadBool(this,pbVar2,&has__proto__);
  pPVar3->hasNonSimpleParams = has__proto__;
  count = 0;
  for (uVar5 = 0; uVar5 < pPVar3->count; uVar5 = uVar5 + 1) {
    pbVar2 = ReadInt32(this,pbVar2,(int *)&count);
    TVar1 = ByteCodeCache::LookupPropertyId(function->byteCodeCache,count);
    (&pPVar3[1].count)[uVar5] = TVar1;
  }
  for (uVar4 = 0; uVar4 < hadDuplicates; uVar4 = uVar4 + 1) {
    pbVar2 = ReadInt32(this,pbVar2,(int *)&count);
    (&pPVar3[1].count)[pPVar3->count + uVar4] = count;
  }
  return pbVar2;
}

Assistant:

const byte * ReadPropertyIdOfFormals(const byte * current, FunctionBody * function)
    {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant = 0;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfPropIdsOfFormals);
#endif

        uint32 count = 0;
        current = ReadUInt32(current, &count);

        byte extraSlotCount = 0;
        current = ReadByte(current, &extraSlotCount);

        PropertyIdArray * propIds = function->AllocatePropertyIdArrayForFormals((extraSlotCount + count) * sizeof(PropertyId), count, extraSlotCount);
        propIds->count = count;

        bool hadDuplicates = false;
        current = ReadBool(current, &hadDuplicates);
        propIds->hadDuplicates = hadDuplicates;

        bool has__proto__ = false;
        current = ReadBool(current, &has__proto__);
        propIds->has__proto__ = has__proto__;

        bool hasNonSimpleParams = false;
        current = ReadBool(current, &hasNonSimpleParams);
        propIds->hasNonSimpleParams = hasNonSimpleParams;

        int id = 0;
        for (uint i = 0; i < propIds->count; ++i)
        {
            current = ReadInt32(current, &id);
            PropertyId propertyId = function->GetByteCodeCache()->LookupPropertyId(id);
            propIds->elements[i] = propertyId;
        }

        for (int i = 0; i < extraSlotCount; ++i)
        {
            current = ReadInt32(current, &id);
            propIds->elements[propIds->count + i] = id;
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndOfPropIdsOfFormals);
#endif

        return current;
    }